

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool contentOnly)

{
  bool bVar1;
  char *pcVar2;
  allocator local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  GetOutputName(&local_40,this,config,false);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&local_40,"BUNDLE_EXTENSION",&local_41);
  pcVar2 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pcVar2 == (char *)0x0) {
    IsXCTestOnApple(this);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar1 = cmMakefile::PlatformIsAppleIos(this->Makefile);
  if ((!bVar1) && (std::__cxx11::string::append((char *)__return_storage_ptr__), !contentOnly)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(const std::string& config,
                                                    bool contentOnly) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".";
  const char *ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext)
    {
    if (this->IsXCTestOnApple())
      {
      ext = "xctest";
      }
    else
      {
      ext = "bundle";
      }
    }
  fpath += ext;
  if(!this->Makefile->PlatformIsAppleIos())
  {
    fpath += "/Contents";
    if(!contentOnly)
      fpath += "/MacOS";
  }
  return fpath;
}